

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_direct.c
# Opt level: O1

void SUNDlsMat_PrintMat(SUNDlsMat A,FILE *outfile)

{
  realtype **pprVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  int local_5c;
  long local_58;
  
  if (A->type == 2) {
    pprVar1 = A->cols;
    fputc(10,(FILE *)outfile);
    uVar4 = (ulong)(uint)A->N;
    if (0 < A->N) {
      local_58 = 0;
      local_5c = 0;
      lVar9 = 0;
      do {
        uVar8 = (int)lVar9 - A->ml;
        uVar6 = (ulong)uVar8;
        iVar5 = A->mu + (int)lVar9;
        iVar2 = (int)uVar4 + -1;
        if (iVar5 < (int)uVar4) {
          iVar2 = iVar5;
        }
        uVar3 = 0;
        if (0 < (int)uVar8) {
          iVar5 = A->ml + local_5c;
          do {
            fprintf((FILE *)outfile,"%12s  ","");
            iVar5 = iVar5 + 1;
            uVar3 = uVar8;
          } while (iVar5 != 0);
        }
        if ((int)uVar3 <= iVar2) {
          if ((int)uVar8 < 1) {
            uVar6 = 0;
          }
          lVar10 = uVar6 - 1;
          lVar7 = local_58 + uVar6 * -8;
          do {
            fprintf((FILE *)outfile,"%12g  ",
                    *(undefined8 *)((long)pprVar1[lVar10 + 1] + lVar7 + (long)A->s_mu * 8));
            lVar10 = lVar10 + 1;
            lVar7 = lVar7 + -8;
          } while (lVar10 < iVar2);
        }
        fputc(10,(FILE *)outfile);
        lVar9 = lVar9 + 1;
        uVar4 = (ulong)A->N;
        local_5c = local_5c + -1;
        local_58 = local_58 + 8;
      } while (lVar9 < (long)uVar4);
    }
  }
  else {
    if (A->type != 1) {
      return;
    }
    fputc(10,(FILE *)outfile);
    if (0 < A->M) {
      lVar9 = 0;
      do {
        if (0 < A->N) {
          lVar10 = 0;
          do {
            fprintf((FILE *)outfile,"%12g  ",A->cols[lVar10][lVar9]);
            lVar10 = lVar10 + 1;
          } while (lVar10 < A->N);
        }
        fputc(10,(FILE *)outfile);
        lVar9 = lVar9 + 1;
      } while (lVar9 < A->M);
    }
  }
  fputc(10,(FILE *)outfile);
  return;
}

Assistant:

void SUNDlsMat_PrintMat(SUNDlsMat A, FILE *outfile)
{
  sunindextype i, j, start, finish;
  realtype **a;

  switch (A->type) {

  case SUNDIALS_DENSE:

    fprintf(outfile, "\n");
    for (i=0; i < A->M; i++) {
      for (j=0; j < A->N; j++) {
#if defined(SUNDIALS_EXTENDED_PRECISION)
        fprintf(outfile, "%12Lg  ", SUNDLS_DENSE_ELEM(A,i,j));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
        fprintf(outfile, "%12g  ", SUNDLS_DENSE_ELEM(A,i,j));
#else
        fprintf(outfile, "%12g  ", SUNDLS_DENSE_ELEM(A,i,j));
#endif
      }
      fprintf(outfile, "\n");
    }
    fprintf(outfile, "\n");

    break;

  case SUNDIALS_BAND:

    a = A->cols;
    fprintf(outfile, "\n");
    for (i=0; i < A->N; i++) {
      start = SUNMAX(0,i-A->ml);
      finish = SUNMIN(A->N-1,i+A->mu);
      for (j=0; j < start; j++) fprintf(outfile, "%12s  ","");
      for (j=start; j <= finish; j++) {
#if defined(SUNDIALS_EXTENDED_PRECISION)
        fprintf(outfile, "%12Lg  ", a[j][i-j+A->s_mu]);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
        fprintf(outfile, "%12g  ", a[j][i-j+A->s_mu]);
#else
        fprintf(outfile, "%12g  ", a[j][i-j+A->s_mu]);
#endif
      }
      fprintf(outfile, "\n");
    }
    fprintf(outfile, "\n");

    break;

  }

}